

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int HistogramCombineStochastic
              (VP8LHistogramSet *image_histo,int *num_used,int min_cluster_size,int *do_greedy)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  VP8LHistogram *pVVar6;
  uint *in_RCX;
  int in_EDX;
  uint uVar7;
  uint uVar8;
  int *in_RSI;
  VP8LHistogramSet *in_RDI;
  int tmp_1;
  int do_eval;
  int is_idx2_best;
  int is_idx1_best;
  HistogramPair *p;
  uint32_t idx2;
  uint32_t idx1;
  uint32_t tmp;
  int64_t curr_cost;
  int num_tries;
  uint32_t rand_range;
  int best_idx2;
  int best_idx1;
  int64_t best_cost;
  int *mapping_index;
  int *mappings;
  int ok;
  int kHistoQueueSize;
  HistoQueue histo_queue;
  VP8LHistogram **histograms;
  int num_tries_no_success;
  int outer_iters;
  int tries_with_no_success;
  uint32_t seed;
  int iter;
  int j;
  int in_stack_ffffffffffffff2c;
  undefined5 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff35;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar9;
  uint64_t in_stack_ffffffffffffff38;
  VP8LHistogram *b;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar10;
  int in_stack_ffffffffffffff48;
  uint uVar11;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  HistogramPair *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int local_80;
  int local_7c;
  VP8LHistogram *local_78;
  void *local_70;
  void *local_68;
  int local_60;
  undefined4 local_5c;
  HistoQueue local_58;
  VP8LHistogram **local_48;
  int local_40;
  int local_3c;
  int local_38;
  uint32_t local_34;
  int local_30;
  int local_2c;
  uint *local_28;
  int local_1c;
  int *local_18;
  VP8LHistogramSet *local_10;
  int local_4;
  
  local_34 = 1;
  local_38 = 0;
  local_3c = *in_RSI;
  local_40 = local_3c / 2;
  local_48 = in_RDI->histograms;
  local_5c = 9;
  local_60 = 0;
  if (*in_RSI < in_EDX) {
    *in_RCX = 1;
    local_4 = 1;
  }
  else {
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_68 = WebPSafeMalloc(in_stack_ffffffffffffff38,
                              CONCAT17(in_stack_ffffffffffffff37,
                                       CONCAT16(in_stack_ffffffffffffff36,
                                                CONCAT15(in_stack_ffffffffffffff35,
                                                         in_stack_ffffffffffffff30))));
    if (local_68 == (void *)0x0) {
      local_4 = 0;
    }
    else {
      iVar4 = HistoQueueInit((HistoQueue *)
                             CONCAT17(in_stack_ffffffffffffff37,
                                      CONCAT16(in_stack_ffffffffffffff36,
                                               CONCAT15(in_stack_ffffffffffffff35,
                                                        in_stack_ffffffffffffff30))),
                             in_stack_ffffffffffffff2c);
      if (iVar4 != 0) {
        local_2c = 0;
        for (local_30 = 0; local_30 < local_10->size; local_30 = local_30 + 1) {
          if (local_48[local_30] != (VP8LHistogram *)0x0) {
            *(int *)((long)local_68 + (long)local_2c * 4) = local_30;
            local_2c = local_2c + 1;
          }
        }
        local_30 = 0;
        while( true ) {
          uVar10 = false;
          if ((local_30 < local_3c) && (uVar10 = false, local_1c <= *local_18)) {
            local_38 = local_38 + 1;
            uVar10 = local_38 < local_40;
          }
          if ((bool)uVar10 == false) break;
          if (local_58.size == 0) {
            b = (VP8LHistogram *)0x0;
          }
          else {
            b = (VP8LHistogram *)(local_58.queue)->cost_diff;
          }
          local_7c = -1;
          local_80 = 1;
          iVar4 = *local_18;
          iVar1 = *local_18;
          iVar2 = *local_18;
          local_78 = b;
          for (local_2c = 0; bVar3 = local_2c < iVar2 / 2, uVar9 = 1 < *local_18 && bVar3,
              1 < *local_18 && bVar3; local_2c = local_2c + 1) {
            uVar5 = MyRand(&local_34);
            uVar7 = uVar5 % (uint)((iVar4 + -1) * iVar1);
            uVar11 = uVar7 / (*local_18 - 1U);
            uVar8 = uVar7 % (*local_18 - 1U);
            if (uVar11 <= uVar8) {
              uVar8 = uVar8 + 1;
            }
            pVVar6 = (VP8LHistogram *)
                     HistoQueuePush((HistoQueue *)
                                    CONCAT44(uVar7,*(undefined4 *)
                                                    ((long)local_68 + (ulong)uVar11 * 4)),
                                    (VP8LHistogram **)
                                    CONCAT44(*(undefined4 *)((long)local_68 + (ulong)uVar8 * 4),
                                             in_stack_ffffffffffffff60),
                                    (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                    (int)in_stack_ffffffffffffff58,
                                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            if (((long)pVVar6 < 0) && (local_78 = pVVar6, local_58.size == local_58.max_size))
            break;
          }
          if (local_58.size != 0) {
            local_7c = (local_58.queue)->idx1;
            local_80 = (local_58.queue)->idx2;
            local_70 = bsearch(&local_80,local_68,(long)*local_18,4,PairComparison);
            memmove(local_70,(void *)((long)local_70 + 4),
                    (((long)*local_18 - ((long)local_70 - (long)local_68 >> 2)) + -1) * 4);
            HistogramAdd((VP8LHistogram *)CONCAT17(uVar10,in_stack_ffffffffffffff40),b,
                         (VP8LHistogram *)
                         CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffff36,
                                                 CONCAT15(in_stack_ffffffffffffff35,
                                                          in_stack_ffffffffffffff30))));
            local_48[local_7c]->bit_cost_ = (local_58.queue)->cost_combo;
            HistogramSetRemoveHistogram(local_10,local_80,local_18);
            local_2c = 0;
            while (local_2c < local_58.size) {
              in_stack_ffffffffffffff58 = local_58.queue + local_2c;
              in_stack_ffffffffffffff36 = true;
              if (in_stack_ffffffffffffff58->idx1 != local_7c) {
                in_stack_ffffffffffffff36 = in_stack_ffffffffffffff58->idx1 == local_80;
              }
              in_stack_ffffffffffffff54 = (uint)(byte)in_stack_ffffffffffffff36;
              in_stack_ffffffffffffff35 = true;
              if (in_stack_ffffffffffffff58->idx2 != local_7c) {
                in_stack_ffffffffffffff35 = in_stack_ffffffffffffff58->idx2 == local_80;
              }
              in_stack_ffffffffffffff50 = (uint)(byte)in_stack_ffffffffffffff35;
              if ((in_stack_ffffffffffffff54 == 0) || (in_stack_ffffffffffffff50 == 0)) {
                if (in_stack_ffffffffffffff54 == 0) {
                  if (in_stack_ffffffffffffff50 != 0) {
                    in_stack_ffffffffffffff58->idx2 = local_7c;
                  }
                  uVar11 = (uint)(in_stack_ffffffffffffff50 != 0);
                }
                else {
                  in_stack_ffffffffffffff58->idx1 = local_7c;
                  uVar11 = 1;
                }
                if (in_stack_ffffffffffffff58->idx2 < in_stack_ffffffffffffff58->idx1) {
                  in_stack_ffffffffffffff48 = in_stack_ffffffffffffff58->idx2;
                  in_stack_ffffffffffffff58->idx2 = in_stack_ffffffffffffff58->idx1;
                  in_stack_ffffffffffffff58->idx1 = in_stack_ffffffffffffff48;
                }
                if ((uVar11 == 0) ||
                   (iVar4 = HistoQueueUpdatePair
                                      ((VP8LHistogram *)CONCAT44(uVar11,in_stack_ffffffffffffff48),
                                       (VP8LHistogram *)CONCAT17(uVar10,in_stack_ffffffffffffff40),
                                       (int64_t)b,
                                       (HistogramPair *)
                                       CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffff36,
                                                               CONCAT15(in_stack_ffffffffffffff35,
                                                                        in_stack_ffffffffffffff30)))
                                      ), iVar4 != 0)) {
                  HistoQueueUpdateHead(&local_58,in_stack_ffffffffffffff58);
                  local_2c = local_2c + 1;
                }
                else {
                  HistoQueuePopPair(&local_58,in_stack_ffffffffffffff58);
                }
              }
              else {
                HistoQueuePopPair(&local_58,in_stack_ffffffffffffff58);
              }
            }
            local_38 = 0;
          }
          local_30 = local_30 + 1;
        }
        *local_28 = (uint)(*local_18 <= local_1c);
        local_60 = 1;
      }
      HistoQueueClear((HistoQueue *)0x194407);
      WebPSafeFree((void *)0x194411);
      local_4 = local_60;
    }
  }
  return local_4;
}

Assistant:

static int HistogramCombineStochastic(VP8LHistogramSet* const image_histo,
                                      int* const num_used, int min_cluster_size,
                                      int* const do_greedy) {
  int j, iter;
  uint32_t seed = 1;
  int tries_with_no_success = 0;
  const int outer_iters = *num_used;
  const int num_tries_no_success = outer_iters / 2;
  VP8LHistogram** const histograms = image_histo->histograms;
  // Priority queue of histogram pairs. Its size of 'kHistoQueueSize'
  // impacts the quality of the compression and the speed: the smaller the
  // faster but the worse for the compression.
  HistoQueue histo_queue;
  const int kHistoQueueSize = 9;
  int ok = 0;
  // mapping from an index in image_histo with no NULL histogram to the full
  // blown image_histo.
  int* mappings;

  if (*num_used < min_cluster_size) {
    *do_greedy = 1;
    return 1;
  }

  mappings = (int*) WebPSafeMalloc(*num_used, sizeof(*mappings));
  if (mappings == NULL) return 0;
  if (!HistoQueueInit(&histo_queue, kHistoQueueSize)) goto End;
  // Fill the initial mapping.
  for (j = 0, iter = 0; iter < image_histo->size; ++iter) {
    if (histograms[iter] == NULL) continue;
    mappings[j++] = iter;
  }
  assert(j == *num_used);

  // Collapse similar histograms in 'image_histo'.
  for (iter = 0;
       iter < outer_iters && *num_used >= min_cluster_size &&
           ++tries_with_no_success < num_tries_no_success;
       ++iter) {
    int* mapping_index;
    int64_t best_cost =
        (histo_queue.size == 0) ? 0 : histo_queue.queue[0].cost_diff;
    int best_idx1 = -1, best_idx2 = 1;
    const uint32_t rand_range = (*num_used - 1) * (*num_used);
    // (*num_used) / 2 was chosen empirically. Less means faster but worse
    // compression.
    const int num_tries = (*num_used) / 2;

    // Pick random samples.
    for (j = 0; *num_used >= 2 && j < num_tries; ++j) {
      int64_t curr_cost;
      // Choose two different histograms at random and try to combine them.
      const uint32_t tmp = MyRand(&seed) % rand_range;
      uint32_t idx1 = tmp / (*num_used - 1);
      uint32_t idx2 = tmp % (*num_used - 1);
      if (idx2 >= idx1) ++idx2;
      idx1 = mappings[idx1];
      idx2 = mappings[idx2];

      // Calculate cost reduction on combination.
      curr_cost =
          HistoQueuePush(&histo_queue, histograms, idx1, idx2, best_cost);
      if (curr_cost < 0) {  // found a better pair?
        best_cost = curr_cost;
        // Empty the queue if we reached full capacity.
        if (histo_queue.size == histo_queue.max_size) break;
      }
    }
    if (histo_queue.size == 0) continue;

    // Get the best histograms.
    best_idx1 = histo_queue.queue[0].idx1;
    best_idx2 = histo_queue.queue[0].idx2;
    assert(best_idx1 < best_idx2);
    // Pop best_idx2 from mappings.
    mapping_index = (int*) bsearch(&best_idx2, mappings, *num_used,
                                   sizeof(best_idx2), &PairComparison);
    assert(mapping_index != NULL);
    memmove(mapping_index, mapping_index + 1, sizeof(*mapping_index) *
        ((*num_used) - (mapping_index - mappings) - 1));
    // Merge the histograms and remove best_idx2 from the queue.
    HistogramAdd(histograms[best_idx2], histograms[best_idx1],
                 histograms[best_idx1]);
    histograms[best_idx1]->bit_cost_ = histo_queue.queue[0].cost_combo;
    HistogramSetRemoveHistogram(image_histo, best_idx2, num_used);
    // Parse the queue and update each pair that deals with best_idx1,
    // best_idx2 or image_histo_size.
    for (j = 0; j < histo_queue.size;) {
      HistogramPair* const p = histo_queue.queue + j;
      const int is_idx1_best = p->idx1 == best_idx1 || p->idx1 == best_idx2;
      const int is_idx2_best = p->idx2 == best_idx1 || p->idx2 == best_idx2;
      int do_eval = 0;
      // The front pair could have been duplicated by a random pick so
      // check for it all the time nevertheless.
      if (is_idx1_best && is_idx2_best) {
        HistoQueuePopPair(&histo_queue, p);
        continue;
      }
      // Any pair containing one of the two best indices should only refer to
      // best_idx1. Its cost should also be updated.
      if (is_idx1_best) {
        p->idx1 = best_idx1;
        do_eval = 1;
      } else if (is_idx2_best) {
        p->idx2 = best_idx1;
        do_eval = 1;
      }
      // Make sure the index order is respected.
      if (p->idx1 > p->idx2) {
        const int tmp = p->idx2;
        p->idx2 = p->idx1;
        p->idx1 = tmp;
      }
      if (do_eval) {
        // Re-evaluate the cost of an updated pair.
        if (!HistoQueueUpdatePair(histograms[p->idx1], histograms[p->idx2], 0,
                                  p)) {
          HistoQueuePopPair(&histo_queue, p);
          continue;
        }
      }
      HistoQueueUpdateHead(&histo_queue, p);
      ++j;
    }
    tries_with_no_success = 0;
  }
  *do_greedy = (*num_used <= min_cluster_size);
  ok = 1;

 End:
  HistoQueueClear(&histo_queue);
  WebPSafeFree(mappings);
  return ok;
}